

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetJavaMutableClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,EnumDescriptor *descriptor)

{
  bool in_CL;
  string local_40;
  
  (anonymous_namespace)::ClassNameWithoutPackage_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)descriptor,descriptor,in_CL);
  GetJavaClassFullName
            (__return_storage_ptr__,this,&local_40,*(FileDescriptor **)(descriptor + 0x10),false,
             false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetJavaMutableClassName(
    const EnumDescriptor* descriptor) {
  return GetJavaClassFullName(ClassNameWithoutPackage(descriptor, false),
                              descriptor->file(), false);
}